

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateMessageSerializationMethods
          (MessageGenerator *this,Printer *printer)

{
  FieldDescriptor **ppFVar1;
  FieldGenerator *pFVar2;
  long lVar3;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  scoped_array<const_google::protobuf::FieldDescriptor_*> local_30;
  
  if (*(int *)(this->descriptor_ + 0x2c) != 0) {
    local_30.array_ = anon_unknown_0::SortFieldsByNumber(this->descriptor_);
    io::Printer::Print(printer,
                       "\n@Override\npublic void writeTo(com.google.protobuf.nano.CodedOutputByteBufferNano output)\n    throws java.io.IOException {\n"
                      );
    io::Printer::Indent(printer);
    if (0 < *(int *)(this->descriptor_ + 0x2c)) {
      lVar3 = 0;
      do {
        ppFVar1 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            (&local_30,lVar3);
        pFVar2 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar1);
        (*pFVar2->_vptr_FieldGenerator[8])(pFVar2,printer);
        lVar3 = lVar3 + 1;
      } while (lVar3 < *(int *)(this->descriptor_ + 0x2c));
    }
    io::Printer::Print(printer,"super.writeTo(output);\n");
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
    io::Printer::Print(printer,
                       "\n@Override\nprotected int computeSerializedSize() {\n  int size = super.computeSerializedSize();\n"
                      );
    io::Printer::Indent(printer);
    if (0 < *(int *)(this->descriptor_ + 0x2c)) {
      lVar3 = 0;
      do {
        ppFVar1 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                            (&local_30,lVar3);
        pFVar2 = FieldGeneratorMap::get(&this->field_generators_,*ppFVar1);
        (*pFVar2->_vptr_FieldGenerator[9])(pFVar2,printer);
        lVar3 = lVar3 + 1;
      } while (lVar3 < *(int *)(this->descriptor_ + 0x2c));
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"  return size;\n}\n");
    if (local_30.array_ != (FieldDescriptor **)0x0) {
      operator_delete__(local_30.array_);
    }
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateMessageSerializationMethods(io::Printer* printer) {
  // Rely on the parent implementations of writeTo() and getSerializedSize()
  // if there are no fields to serialize in this message.
  if (descriptor_->field_count() == 0) {
    return;
  }

  scoped_array<const FieldDescriptor*> sorted_fields(
    SortFieldsByNumber(descriptor_));

  printer->Print(
    "\n"
    "@Override\n"
    "public void writeTo(com.google.protobuf.nano.CodedOutputByteBufferNano output)\n"
    "    throws java.io.IOException {\n");
  printer->Indent();

  // Output the fields in sorted order
  for (int i = 0; i < descriptor_->field_count(); i++) {
    GenerateSerializeOneField(printer, sorted_fields[i]);
  }

  // The parent implementation will write any unknown fields if necessary.
  printer->Print(
    "super.writeTo(output);\n");

  printer->Outdent();
  printer->Print("}\n");

  // The parent implementation will get the serialized size for unknown
  // fields if necessary.
  printer->Print(
    "\n"
    "@Override\n"
    "protected int computeSerializedSize() {\n"
    "  int size = super.computeSerializedSize();\n");
  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(sorted_fields[i]).GenerateSerializedSizeCode(printer);
  }

  printer->Outdent();
  printer->Print(
    "  return size;\n"
    "}\n");
}